

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::ContextShaderProgram::shadeFragments
          (ContextShaderProgram *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  int iVar1;
  GenericVec4 *pGVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  Vec4 color;
  deUint32 local_28;
  deUint32 local_24;
  deUint32 local_20;
  deUint32 local_1c;
  
  iVar6 = 0;
  rr::readTriangleVarying<float>((rr *)&local_28,packets,context,0,0);
  if (0 < numPackets) {
    pGVar2 = context->outputArray;
    iVar1 = context->numFragmentOutputs;
    uVar3 = 0;
    do {
      lVar4 = 4;
      iVar5 = iVar6;
      do {
        pGVar2[iVar5].v.uData[0] = local_28;
        pGVar2[iVar5].v.uData[1] = local_24;
        pGVar2[iVar5].v.uData[2] = local_20;
        pGVar2[iVar5].v.uData[3] = local_1c;
        iVar5 = iVar5 + iVar1;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      uVar3 = uVar3 + 1;
      iVar6 = iVar6 + iVar1 * 4;
    } while (uVar3 != (uint)numPackets);
  }
  return;
}

Assistant:

void ContextShaderProgram::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const size_t varyingLocColor = 0;

	// Triangles are flashaded
	tcu::Vec4 color = rr::readTriangleVarying<float>(packets[0], context, varyingLocColor, 0);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
}